

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O0

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ResetCurMatrix::operator()
          (ResetCurMatrix *this,iterator_t *str,iterator_t *end)

{
  long *in_RDI;
  
  if ((*(byte *)(*in_RDI + 0x78) & 1) != 0) {
    ClearCurMatrix((ParserPOMDPFormat_Spirit *)this);
  }
  return;
}

Assistant:

void operator()(iterator_t str, iterator_t end) const
            {
                if(DEBUG_POMDP_PARSE)
                    std::cout << "ResetCurMatrix() called... ";
                if(_m_po->_m_matrixModified)
                {
                    if(DEBUG_POMDP_PARSE)
                        std::cout << "resetting current matrix..." ;
                    
                    _m_po->ClearCurMatrix();
                }
                if(DEBUG_POMDP_PARSE)
                    std::cout << std::endl;
            }